

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O3

void __thiscall bubbleJson::BubbleJson::ParseWhitespace(BubbleJson *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->context->json;
  while (((ulong)*pbVar1 < 0x21 && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
  }
  this->context->json = (char *)pbVar1;
  return;
}

Assistant:

void BubbleJson::ParseWhitespace()
{
    const char *p = this->context->json;
    while (*p == ' ' || *p == '\n' || *p == '\t' || *p == '\r')
        p++;
    this->context->json = p;
}